

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneFormat::TimeZoneFormat(TimeZoneFormat *this,Locale *locale,UErrorCode *status)

{
  undefined1 *this_00;
  undefined1 *this_01;
  char *pcVar1;
  UBool UVar2;
  int32_t iVar3;
  size_t sVar4;
  TimeZoneNames *pTVar5;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UChar *pUVar6;
  UChar *pUVar7;
  UChar *pUVar8;
  NumberingSystem *this_02;
  long lVar9;
  ConstChar16Ptr local_1f0;
  ConstChar16Ptr local_1e8;
  ConstChar16Ptr local_1e0;
  ConstChar16Ptr local_1d8;
  ConstChar16Ptr local_1d0;
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  ConstChar16Ptr local_1a8;
  UResourceBundle *local_1a0;
  UnicodeString *local_198;
  UnicodeString *local_190;
  UnicodeString *local_188;
  Locale *local_180;
  char16_t *local_178;
  char16_t *local_168;
  char16_t *local_158;
  char16_t *local_148;
  char16_t *local_138;
  char16_t *local_128;
  UChar *local_118;
  UChar *local_108;
  UChar *local_f8;
  UChar *local_e8;
  char loc [157];
  
  Format::Format(&this->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__TimeZoneFormat_003a1e58;
  Locale::Locale(&this->fLocale,locale);
  local_188 = &this->fGMTPattern;
  this->fTimeZoneNames = (TimeZoneNames *)0x0;
  this->fTimeZoneGenericNames = (TimeZoneGenericNames *)0x0;
  (this->fGMTPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fGMTPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  lVar9 = 0x280;
  do {
    *(undefined ***)((this->super_Format).actualLocale + lVar9 + -8) = &PTR__UnicodeString_003b0268;
    pcVar1 = (this->super_Format).actualLocale + lVar9;
    pcVar1[0] = '\x02';
    pcVar1[1] = '\0';
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0x400);
  (this->fGMTZeroFormat).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fGMTZeroFormat).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fDefParseOptionFlags = 0;
  local_190 = &this->fGMTPatternPrefix;
  (this->fGMTPatternPrefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fGMTPatternPrefix).fUnion.fStackFields.fLengthAndFlags = 2;
  local_198 = &this->fGMTPatternSuffix;
  (this->fGMTPatternSuffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fGMTPatternSuffix).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fTZDBTimeZoneNames = (TZDBTimeZoneNames *)0x0;
  for (lVar9 = 0x9e; lVar9 != 0xa4; lVar9 = lVar9 + 1) {
    pcVar1 = (this->super_Format).actualLocale + lVar9 * 8 + -8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  pcVar1 = (this->fLocale).country;
  local_180 = &this->fLocale;
  sVar4 = strlen(pcVar1);
  if ((int)sVar4 == 0) {
    uloc_addLikelySubtags_63((this->fLocale).fullName,loc,0x9d,status);
    iVar3 = uloc_getCountry_63(loc,this->fTargetRegion,4,status);
    if (U_ZERO_ERROR < *status) {
      return;
    }
    this->fTargetRegion[iVar3] = '\0';
  }
  else if ((int)sVar4 < 4) {
    strcpy(this->fTargetRegion,pcVar1);
  }
  else {
    this->fTargetRegion[0] = '\0';
  }
  pTVar5 = TimeZoneNames::createInstance(locale,status);
  this->fTimeZoneNames = pTVar5;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  resB = ures_open_63("icudt63l-zone",locale->fullName,status);
  resB_00 = ures_getByKeyWithFallback_63(resB,"zoneStrings",(UResourceBundle *)0x0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_1a0 = resB;
    pUVar6 = ures_getStringByKeyWithFallback_63(resB_00,"gmtFormat",(int32_t *)loc,status);
    pUVar8 = (UChar *)0x0;
    if (0 < (int)loc._0_4_) {
      pUVar8 = pUVar6;
    }
    pUVar6 = ures_getStringByKeyWithFallback_63(resB_00,"gmtZeroFormat",(int32_t *)loc,status);
    if (0 < (int)loc._0_4_) {
      local_1a8.p_ = pUVar6;
      UnicodeString::setTo(&this->fGMTZeroFormat,'\x01',&local_1a8,loc._0_4_);
      local_e8 = local_1a8.p_;
    }
    pUVar7 = ures_getStringByKeyWithFallback_63(resB_00,"hourFormat",(int32_t *)loc,status);
    pUVar6 = (UChar *)0x0;
    if (0 < (int)loc._0_4_) {
      pUVar6 = pUVar7;
    }
    ures_close_63(resB_00);
    ures_close_63(local_1a0);
  }
  else {
    pUVar8 = (UChar *)0x0;
    pUVar6 = (UChar *)0x0;
  }
  local_1b0.p_ = (char16_t *)DEFAULT_GMT_PATTERN;
  if (pUVar8 != (UChar *)0x0) {
    local_1b0.p_ = pUVar8;
  }
  UnicodeString::UnicodeString((UnicodeString *)loc,'\x01',&local_1b0,-1);
  initGMTPattern(this,(UnicodeString *)loc,status);
  this_00 = &this->field_0x280;
  UnicodeString::~UnicodeString((UnicodeString *)loc);
  local_f8 = local_1b0.p_;
  if ((pUVar6 == (UChar *)0x0) || (pUVar8 = u_strchr_63(pUVar6,L';'), pUVar8 == (UChar *)0x0)) {
LAB_00202012:
    local_1c8.p_ = L"+H";
    UnicodeString::setTo((UnicodeString *)&this->field_0x380,'\x01',&local_1c8,-1);
    local_128 = local_1c8.p_;
    local_1d0.p_ = (char16_t *)DEFAULT_GMT_POSITIVE_HM;
    UnicodeString::setTo((UnicodeString *)this_00,'\x01',&local_1d0,-1);
    local_138 = local_1d0.p_;
    local_1d8.p_ = (char16_t *)DEFAULT_GMT_POSITIVE_HMS;
    UnicodeString::setTo((UnicodeString *)&this->field_0x2c0,'\x01',&local_1d8,-1);
    local_148 = local_1d8.p_;
    local_1e0.p_ = L"-H";
    UnicodeString::setTo((UnicodeString *)&this->field_0x3c0,'\x01',&local_1e0,-1);
    local_158 = local_1e0.p_;
    local_1e8.p_ = (char16_t *)DEFAULT_GMT_NEGATIVE_HM;
    UnicodeString::setTo((UnicodeString *)&this->field_0x300,'\x01',&local_1e8,-1);
    local_168 = local_1e8.p_;
    local_1f0.p_ = (char16_t *)DEFAULT_GMT_NEGATIVE_HMS;
    UnicodeString::setTo((UnicodeString *)&this->field_0x340,'\x01',&local_1f0,-1);
    local_178 = local_1f0.p_;
  }
  else {
    loc[0] = '\0';
    loc[1] = '\0';
    loc[2] = '\0';
    loc[3] = '\0';
    local_1b8.p_ = pUVar6;
    UnicodeString::setTo
              ((UnicodeString *)this_00,'\0',&local_1b8,
               (int32_t)((ulong)((long)pUVar8 - (long)pUVar6) >> 1));
    local_108 = local_1b8.p_;
    this_01 = &this->field_0x300;
    local_1c0.p_ = pUVar8 + 1;
    UnicodeString::setTo((UnicodeString *)this_01,'\x01',&local_1c0,-1);
    local_118 = local_1c0.p_;
    expandOffsetPattern((UnicodeString *)this_00,(UnicodeString *)&this->field_0x2c0,
                        (UErrorCode *)loc);
    expandOffsetPattern((UnicodeString *)this_01,(UnicodeString *)&this->field_0x340,
                        (UErrorCode *)loc);
    truncateOffsetPattern
              ((UnicodeString *)this_00,(UnicodeString *)&this->field_0x380,(UErrorCode *)loc);
    truncateOffsetPattern
              ((UnicodeString *)this_01,(UnicodeString *)&this->field_0x3c0,(UErrorCode *)loc);
    if (0 < (int)loc._0_4_) goto LAB_00202012;
  }
  initGMTOffsetPatterns(this,status);
  this_02 = NumberingSystem::createInstance(locale,status);
  if (this_02 == (NumberingSystem *)0x0) {
    this->fGMTOffsetDigits[4] = 0x34;
    this->fGMTOffsetDigits[5] = 0x35;
    this->fGMTOffsetDigits[6] = 0x36;
    this->fGMTOffsetDigits[7] = 0x37;
    this->fGMTOffsetDigits[0] = 0x30;
    this->fGMTOffsetDigits[1] = 0x31;
    this->fGMTOffsetDigits[2] = 0x32;
    this->fGMTOffsetDigits[3] = 0x33;
    this->fGMTOffsetDigits[8] = 0x38;
    this->fGMTOffsetDigits[9] = 0x39;
    return;
  }
  UVar2 = NumberingSystem::isAlgorithmic(this_02);
  if (UVar2 == '\0') {
    (*(this_02->super_UObject)._vptr_UObject[3])(loc,this_02);
    UVar2 = toCodePoints((UnicodeString *)loc,this->fGMTOffsetDigits,10);
    UnicodeString::~UnicodeString((UnicodeString *)loc);
    if (UVar2 != '\0') goto LAB_002021ea;
  }
  this->fGMTOffsetDigits[4] = 0x34;
  this->fGMTOffsetDigits[5] = 0x35;
  this->fGMTOffsetDigits[6] = 0x36;
  this->fGMTOffsetDigits[7] = 0x37;
  this->fGMTOffsetDigits[0] = 0x30;
  this->fGMTOffsetDigits[1] = 0x31;
  this->fGMTOffsetDigits[2] = 0x32;
  this->fGMTOffsetDigits[3] = 0x33;
  this->fGMTOffsetDigits[8] = 0x38;
  this->fGMTOffsetDigits[9] = 0x39;
LAB_002021ea:
  (*(this_02->super_UObject)._vptr_UObject[1])(this_02);
  return;
}

Assistant:

TimeZoneFormat::TimeZoneFormat(const Locale& locale, UErrorCode& status) 
: fLocale(locale), fTimeZoneNames(NULL), fTimeZoneGenericNames(NULL),
  fDefParseOptionFlags(0), fTZDBTimeZoneNames(NULL) {

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        fGMTOffsetPatternItems[i] = NULL;
    }

    const char* region = fLocale.getCountry();
    int32_t regionLen = static_cast<int32_t>(uprv_strlen(region));
    if (regionLen == 0) {
        char loc[ULOC_FULLNAME_CAPACITY];
        uloc_addLikelySubtags(fLocale.getName(), loc, sizeof(loc), &status);

        regionLen = uloc_getCountry(loc, fTargetRegion, sizeof(fTargetRegion), &status);
        if (U_SUCCESS(status)) {
            fTargetRegion[regionLen] = 0;
        } else {
            return;
        }
    } else if (regionLen < (int32_t)sizeof(fTargetRegion)) {
        uprv_strcpy(fTargetRegion, region);
    } else {
        fTargetRegion[0] = 0;
    }

    fTimeZoneNames = TimeZoneNames::createInstance(locale, status);
    // fTimeZoneGenericNames is lazily instantiated
    if (U_FAILURE(status)) {
        return;
    }

    const UChar* gmtPattern = NULL;
    const UChar* hourFormats = NULL;

    UResourceBundle *zoneBundle = ures_open(U_ICUDATA_ZONE, locale.getName(), &status);
    UResourceBundle *zoneStringsArray = ures_getByKeyWithFallback(zoneBundle, gZoneStringsTag, NULL, &status);
    if (U_SUCCESS(status)) {
        const UChar* resStr;
        int32_t len;
        resStr = ures_getStringByKeyWithFallback(zoneStringsArray, gGmtFormatTag, &len, &status);
        if (len > 0) {
            gmtPattern = resStr;
        }
        resStr = ures_getStringByKeyWithFallback(zoneStringsArray, gGmtZeroFormatTag, &len, &status);
        if (len > 0) {
            fGMTZeroFormat.setTo(TRUE, resStr, len);
        }
        resStr = ures_getStringByKeyWithFallback(zoneStringsArray, gHourFormatTag, &len, &status);
        if (len > 0) {
            hourFormats = resStr;
        }
        ures_close(zoneStringsArray);
        ures_close(zoneBundle);
    }

    if (gmtPattern == NULL) {
        gmtPattern = DEFAULT_GMT_PATTERN;
    }
    initGMTPattern(UnicodeString(TRUE, gmtPattern, -1), status);

    UBool useDefaultOffsetPatterns = TRUE;
    if (hourFormats) {
        UChar *sep = u_strchr(hourFormats, (UChar)0x003B /* ';' */);
        if (sep != NULL) {
            UErrorCode tmpStatus = U_ZERO_ERROR;
            fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM].setTo(FALSE, hourFormats, (int32_t)(sep - hourFormats));
            fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM].setTo(TRUE, sep + 1, -1);
            expandOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HMS], tmpStatus);
            expandOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HMS], tmpStatus);
            truncateOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_H], tmpStatus);
            truncateOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_H], tmpStatus);
            if (U_SUCCESS(tmpStatus)) {
                useDefaultOffsetPatterns = FALSE;
            }
        }
    }
    if (useDefaultOffsetPatterns) {
        fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_H].setTo(TRUE, DEFAULT_GMT_POSITIVE_H, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM].setTo(TRUE, DEFAULT_GMT_POSITIVE_HM, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HMS].setTo(TRUE, DEFAULT_GMT_POSITIVE_HMS, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_H].setTo(TRUE, DEFAULT_GMT_NEGATIVE_H, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM].setTo(TRUE, DEFAULT_GMT_NEGATIVE_HM, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HMS].setTo(TRUE, DEFAULT_GMT_NEGATIVE_HMS, -1);
    }
    initGMTOffsetPatterns(status);

    NumberingSystem* ns = NumberingSystem::createInstance(locale, status);
    UBool useDefDigits = TRUE;
    if (ns && !ns->isAlgorithmic()) {
        UnicodeString digits = ns->getDescription();
        useDefDigits = !toCodePoints(digits, fGMTOffsetDigits, 10);
    }
    if (useDefDigits) {
        uprv_memcpy(fGMTOffsetDigits, DEFAULT_GMT_DIGITS, sizeof(UChar32) * 10);
    }
    delete ns;
}